

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetTargetPropertiesCommand.cxx
# Opt level: O0

bool cmSetTargetPropertiesCommand::SetOneTarget
               (string *tname,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *propertyPairs,cmMakefile *mf)

{
  cmTarget *this;
  size_type sVar1;
  reference pvVar2;
  char *value;
  undefined4 local_34;
  uint k;
  cmTarget *target;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *propertyPairs_local;
  string *tname_local;
  
  this = cmMakefile::FindTargetToUse(mf,tname,false);
  if (this == (cmTarget *)0x0) {
    tname_local._7_1_ = false;
  }
  else {
    local_34 = 0;
    while( true ) {
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(propertyPairs);
      if (sVar1 <= local_34) break;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](propertyPairs,(ulong)local_34);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](propertyPairs,(ulong)(local_34 + 1));
      value = (char *)std::__cxx11::string::c_str();
      cmTarget::SetProperty(this,pvVar2,value);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](propertyPairs,(ulong)local_34);
      cmTarget::CheckProperty(this,pvVar2,mf);
      local_34 = local_34 + 2;
    }
    tname_local._7_1_ = true;
  }
  return tname_local._7_1_;
}

Assistant:

bool cmSetTargetPropertiesCommand
::SetOneTarget(const std::string& tname,
               std::vector<std::string> &propertyPairs,
               cmMakefile *mf)
{
  if(cmTarget* target = mf->FindTargetToUse(tname))
    {
    // now loop through all the props and set them
    unsigned int k;
    for (k = 0; k < propertyPairs.size(); k = k + 2)
      {
      target->SetProperty(propertyPairs[k],
                          propertyPairs[k+1].c_str());
      target->CheckProperty(propertyPairs[k], mf);
      }
    }
  // if file is not already in the makefile, then add it
  else
    {
    return false;
    }
  return true;
}